

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# three_dim_model.cpp
# Opt level: O0

void __thiscall
MODEL3D::three_dim_model::build_layer_box
          (three_dim_model *this,int *layer_number,IntPoint *a,IntPoint *b,IntPoint *c,IntPoint *d,
          geofile *generated_geofile)

{
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<int> __l_01;
  initializer_list<int> __l_02;
  initializer_list<int> __l_03;
  initializer_list<int> __l_04;
  initializer_list<int> __l_05;
  mapped_type *pmVar1;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_GEO::point>_>,_bool> pVar2;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_GEO::line>_>,_bool> pVar3;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_bool>
  pVar4;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_int>_>,_bool> pVar5;
  pair<const_int,_int> local_b78;
  _Base_ptr local_b70;
  undefined1 local_b68;
  allocator<int> local_b59;
  int local_b58;
  int local_b54;
  int local_b50;
  int local_b4c;
  int local_b48;
  int local_b44;
  iterator local_b40;
  size_type local_b38;
  vector<int,_std::allocator<int>_> local_b30;
  pair<const_int,_std::vector<int,_std::allocator<int>_>_> local_b18;
  _Base_ptr local_af8;
  undefined1 local_af0;
  pair<const_int,_int> local_ae8;
  _Base_ptr local_ae0;
  undefined1 local_ad8;
  allocator<int> local_ac9;
  int local_ac8;
  int local_ac4;
  int local_ac0;
  int local_abc;
  iterator local_ab8;
  size_type local_ab0;
  vector<int,_std::allocator<int>_> local_aa8;
  pair<const_int,_std::vector<int,_std::allocator<int>_>_> local_a90;
  _Base_ptr local_a70;
  undefined1 local_a68;
  pair<const_int,_int> local_a60;
  _Base_ptr local_a58;
  undefined1 local_a50;
  allocator<int> local_a41;
  int local_a40;
  int local_a3c;
  int local_a38;
  int local_a34;
  iterator local_a30;
  size_type local_a28;
  vector<int,_std::allocator<int>_> local_a20;
  pair<const_int,_std::vector<int,_std::allocator<int>_>_> local_a08;
  _Base_ptr local_9e8;
  undefined1 local_9e0;
  pair<const_int,_GEO::line> local_9d4;
  _Base_ptr local_9c8;
  undefined1 local_9c0;
  pair<const_int,_int> local_9b8;
  _Base_ptr local_9b0;
  undefined1 local_9a8;
  allocator<int> local_999;
  int local_998;
  int local_994;
  int local_990;
  int local_98c;
  iterator local_988;
  size_type local_980;
  vector<int,_std::allocator<int>_> local_978;
  pair<const_int,_std::vector<int,_std::allocator<int>_>_> local_960;
  _Base_ptr local_940;
  undefined1 local_938;
  pair<const_int,_GEO::line> local_92c;
  _Base_ptr local_920;
  undefined1 local_918;
  pair<const_int,_int> local_910;
  _Base_ptr local_908;
  undefined1 local_900;
  allocator<int> local_8f1;
  int local_8f0;
  int local_8ec;
  int local_8e8;
  int local_8e4;
  iterator local_8e0;
  size_type local_8d8;
  vector<int,_std::allocator<int>_> local_8d0;
  pair<const_int,_std::vector<int,_std::allocator<int>_>_> local_8b8;
  _Base_ptr local_898;
  undefined1 local_890;
  pair<const_int,_GEO::line> local_884;
  _Base_ptr local_878;
  undefined1 local_870;
  pair<const_int,_GEO::line> local_864;
  _Base_ptr local_858;
  undefined1 local_850;
  pair<const_int,_int> local_848;
  _Base_ptr local_840;
  undefined1 local_838;
  allocator<int> local_829;
  int local_828;
  int local_824;
  int local_820;
  int local_81c;
  iterator local_818;
  size_type local_810;
  vector<int,_std::allocator<int>_> local_808;
  pair<const_int,_std::vector<int,_std::allocator<int>_>_> local_7f0;
  _Base_ptr local_7d0;
  undefined1 local_7c8;
  pair<const_int,_GEO::line> local_7bc;
  _Base_ptr local_7b0;
  undefined1 local_7a8;
  pair<const_int,_GEO::line> local_79c;
  _Base_ptr local_790;
  undefined1 local_788;
  pair<const_int,_GEO::line> local_77c;
  _Base_ptr local_770;
  undefined1 local_768;
  pair<const_int,_GEO::line> local_75c;
  _Base_ptr local_750;
  undefined1 local_748;
  pair<const_int,_GEO::point> local_740;
  _Base_ptr local_718;
  undefined1 local_710;
  pair<const_int,_GEO::point> local_708;
  _Base_ptr local_6e0;
  undefined1 local_6d8;
  pair<const_int,_GEO::point> local_6d0;
  _Base_ptr local_6a8;
  undefined1 local_6a0;
  pair<const_int,_GEO::point> local_698;
  _Base_ptr local_670;
  undefined1 local_668;
  pair<const_int,_int> local_660;
  _Base_ptr local_658;
  undefined1 local_650;
  allocator<int> local_641;
  int local_640;
  int local_63c;
  int local_638;
  int local_634;
  iterator local_630;
  size_type local_628;
  vector<int,_std::allocator<int>_> local_620;
  pair<const_int,_std::vector<int,_std::allocator<int>_>_> local_608;
  _Base_ptr local_5e8;
  undefined1 local_5e0;
  pair<const_int,_GEO::line> local_5d4;
  _Base_ptr local_5c8;
  undefined1 local_5c0;
  pair<const_int,_GEO::line> local_5b4;
  _Base_ptr local_5a8;
  undefined1 local_5a0;
  pair<const_int,_GEO::line> local_594;
  _Base_ptr local_588;
  undefined1 local_580;
  pair<const_int,_GEO::line> local_574;
  line local_568;
  line in_line;
  pair<const_int,_GEO::point> local_550;
  _Base_ptr local_528;
  undefined1 local_520;
  pair<const_int,_GEO::point> local_518;
  _Base_ptr local_4f0;
  undefined1 local_4e8;
  pair<const_int,_GEO::point> local_4e0;
  _Base_ptr local_4b8;
  undefined1 local_4b0;
  pair<const_int,_GEO::point> local_4a8;
  int local_480;
  int local_47c;
  int vol_count;
  int sur_loop_count;
  int cur_loop_count;
  int plane_sur_count;
  int line_count;
  int point_count;
  point eight;
  point seven;
  point six;
  point five;
  point four;
  point three;
  point two;
  point one;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> volumes_map;
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  surface_loops_map;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> plane_surfaces_map;
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  curve_loops_map;
  map<int,_GEO::line,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::line>_>_> lines_map;
  map<int,_GEO::point,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::point>_>_>
  points_map;
  undefined1 local_238 [8];
  geofile base_shape;
  int thickness;
  int base_height;
  IntPoint *d_local;
  IntPoint *c_local;
  IntPoint *b_local;
  IntPoint *a_local;
  int *layer_number_local;
  three_dim_model *this_local;
  
  pmVar1 = std::
           map<int,_MODEL3D::Layer_prop,_std::less<int>,_std::allocator<std::pair<const_int,_MODEL3D::Layer_prop>_>_>
           ::operator[](&this->proc_info_map,layer_number);
  base_shape.physical_volumes_map._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
       pmVar1->z_start;
  pmVar1 = std::
           map<int,_MODEL3D::Layer_prop,_std::less<int>,_std::allocator<std::pair<const_int,_MODEL3D::Layer_prop>_>_>
           ::operator[](&this->proc_info_map,layer_number);
  base_shape.physical_volumes_map._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ =
       pmVar1->thickness;
  GEO::geofile::geofile((geofile *)local_238);
  GEO::geofile::switch_to_OpenCASCADE((geofile *)local_238);
  std::map<int,_GEO::point,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::point>_>_>::map
            ((map<int,_GEO::point,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::point>_>_>
              *)&lines_map._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::map<int,_GEO::line,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::line>_>_>::map
            ((map<int,_GEO::line,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::line>_>_>
              *)&curve_loops_map._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::map((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
         *)&plane_surfaces_map._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::map
            ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
             &surface_loops_map._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::map((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
         *)&volumes_map._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::map
            ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
             &one.char_len);
  cur_loop_count = this->ln_cnt;
  sur_loop_count = this->ps_cnt;
  vol_count = this->cl_cnt;
  local_47c = this->sl_cnt;
  local_480 = this->vol_cnt;
  two.char_len = (double)a->X;
  one.x = (double)a->Y;
  one.y = (double)base_shape.physical_volumes_map._M_t._M_impl.super__Rb_tree_header._M_node_count.
                  _4_4_;
  one.z = this->model_default_char_length;
  plane_sur_count = this->pnt_cnt + 1;
  std::pair<const_int,_GEO::point>::pair<int_&,_GEO::point_&,_true>
            (&local_4a8,&plane_sur_count,(point *)&two.char_len);
  pVar2 = std::
          map<int,_GEO::point,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::point>_>_>::
          insert((map<int,_GEO::point,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::point>_>_>
                  *)&lines_map._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_4a8);
  local_4b8 = (_Base_ptr)pVar2.first._M_node;
  local_4b0 = pVar2.second;
  three.char_len = (double)b->X;
  two.x = (double)b->Y;
  two.y = (double)base_shape.physical_volumes_map._M_t._M_impl.super__Rb_tree_header._M_node_count.
                  _4_4_;
  two.z = this->model_default_char_length;
  plane_sur_count = plane_sur_count + 1;
  std::pair<const_int,_GEO::point>::pair<int_&,_GEO::point_&,_true>
            (&local_4e0,&plane_sur_count,(point *)&three.char_len);
  pVar2 = std::
          map<int,_GEO::point,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::point>_>_>::
          insert((map<int,_GEO::point,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::point>_>_>
                  *)&lines_map._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_4e0);
  local_4f0 = (_Base_ptr)pVar2.first._M_node;
  local_4e8 = pVar2.second;
  four.char_len = (double)c->X;
  three.x = (double)c->Y;
  three.y = (double)base_shape.physical_volumes_map._M_t._M_impl.super__Rb_tree_header._M_node_count
                    ._4_4_;
  three.z = this->model_default_char_length;
  plane_sur_count = plane_sur_count + 1;
  std::pair<const_int,_GEO::point>::pair<int_&,_GEO::point_&,_true>
            (&local_518,&plane_sur_count,(point *)&four.char_len);
  pVar2 = std::
          map<int,_GEO::point,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::point>_>_>::
          insert((map<int,_GEO::point,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::point>_>_>
                  *)&lines_map._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_518);
  local_528 = (_Base_ptr)pVar2.first._M_node;
  local_520 = pVar2.second;
  five.char_len = (double)d->X;
  four.x = (double)d->Y;
  four.y = (double)base_shape.physical_volumes_map._M_t._M_impl.super__Rb_tree_header._M_node_count.
                   _4_4_;
  four.z = this->model_default_char_length;
  plane_sur_count = plane_sur_count + 1;
  std::pair<const_int,_GEO::point>::pair<int_&,_GEO::point_&,_true>
            (&local_550,&plane_sur_count,(point *)&five.char_len);
  pVar2 = std::
          map<int,_GEO::point,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::point>_>_>::
          insert((map<int,_GEO::point,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::point>_>_>
                  *)&lines_map._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_550);
  in_line = (line)pVar2.first._M_node;
  local_568.start = plane_sur_count + -3;
  local_568.end = plane_sur_count + -2;
  cur_loop_count = cur_loop_count + 1;
  std::pair<const_int,_GEO::line>::pair<int_&,_GEO::line_&,_true>
            (&local_574,&cur_loop_count,&local_568);
  pVar3 = std::
          map<int,_GEO::line,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::line>_>_>::
          insert((map<int,_GEO::line,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::line>_>_>
                  *)&curve_loops_map._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_574);
  local_588 = (_Base_ptr)pVar3.first._M_node;
  local_580 = pVar3.second;
  local_568.start = plane_sur_count + -2;
  local_568.end = plane_sur_count + -1;
  cur_loop_count = cur_loop_count + 1;
  std::pair<const_int,_GEO::line>::pair<int_&,_GEO::line_&,_true>
            (&local_594,&cur_loop_count,&local_568);
  pVar3 = std::
          map<int,_GEO::line,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::line>_>_>::
          insert((map<int,_GEO::line,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::line>_>_>
                  *)&curve_loops_map._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_594);
  local_5a8 = (_Base_ptr)pVar3.first._M_node;
  local_5a0 = pVar3.second;
  local_568.start = plane_sur_count + -1;
  local_568.end = plane_sur_count;
  cur_loop_count = cur_loop_count + 1;
  std::pair<const_int,_GEO::line>::pair<int_&,_GEO::line_&,_true>
            (&local_5b4,&cur_loop_count,&local_568);
  pVar3 = std::
          map<int,_GEO::line,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::line>_>_>::
          insert((map<int,_GEO::line,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::line>_>_>
                  *)&curve_loops_map._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_5b4);
  local_5c8 = (_Base_ptr)pVar3.first._M_node;
  local_5c0 = pVar3.second;
  local_568.start = plane_sur_count;
  local_568.end = plane_sur_count + -3;
  cur_loop_count = cur_loop_count + 1;
  std::pair<const_int,_GEO::line>::pair<int_&,_GEO::line_&,_true>
            (&local_5d4,&cur_loop_count,&local_568);
  pVar3 = std::
          map<int,_GEO::line,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::line>_>_>::
          insert((map<int,_GEO::line,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::line>_>_>
                  *)&curve_loops_map._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_5d4);
  local_5e8 = (_Base_ptr)pVar3.first._M_node;
  local_5e0 = pVar3.second;
  vol_count = vol_count + 1;
  local_640 = plane_sur_count + -3;
  local_63c = plane_sur_count + -2;
  local_638 = plane_sur_count + -1;
  local_634 = plane_sur_count;
  local_630 = &local_640;
  local_628 = 4;
  std::allocator<int>::allocator(&local_641);
  __l_05._M_len = local_628;
  __l_05._M_array = local_630;
  std::vector<int,_std::allocator<int>_>::vector(&local_620,__l_05,&local_641);
  std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>::pair<int_&,_true>
            (&local_608,&vol_count,&local_620);
  pVar4 = std::
          map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
          ::insert((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                    *)&plane_surfaces_map._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   &local_608);
  local_658 = (_Base_ptr)pVar4.first._M_node;
  local_650 = pVar4.second;
  std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>::~pair(&local_608);
  std::vector<int,_std::allocator<int>_>::~vector(&local_620);
  std::allocator<int>::~allocator(&local_641);
  sur_loop_count = sur_loop_count + 1;
  std::pair<const_int,_int>::pair<int_&,_int_&,_true>(&local_660,&sur_loop_count,&sur_loop_count);
  pVar5 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::insert
                    ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                     &surface_loops_map._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_660)
  ;
  local_670 = (_Base_ptr)pVar5.first._M_node;
  local_668 = pVar5.second;
  six.char_len = (double)a->X;
  five.x = (double)a->Y;
  five.y = (double)(base_shape.physical_volumes_map._M_t._M_impl.super__Rb_tree_header._M_node_count
                    ._4_4_ + (int)base_shape.physical_volumes_map._M_t._M_impl.super__Rb_tree_header
                                  ._M_node_count);
  five.z = this->model_default_char_length;
  plane_sur_count = plane_sur_count + 1;
  std::pair<const_int,_GEO::point>::pair<int_&,_GEO::point_&,_true>
            (&local_698,&plane_sur_count,(point *)&six.char_len);
  pVar2 = std::
          map<int,_GEO::point,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::point>_>_>::
          insert((map<int,_GEO::point,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::point>_>_>
                  *)&lines_map._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_698);
  local_6a8 = (_Base_ptr)pVar2.first._M_node;
  local_6a0 = pVar2.second;
  seven.char_len = (double)b->X;
  six.x = (double)b->Y;
  six.y = (double)(base_shape.physical_volumes_map._M_t._M_impl.super__Rb_tree_header._M_node_count.
                   _4_4_ + (int)base_shape.physical_volumes_map._M_t._M_impl.super__Rb_tree_header.
                                _M_node_count);
  six.z = this->model_default_char_length;
  plane_sur_count = plane_sur_count + 1;
  std::pair<const_int,_GEO::point>::pair<int_&,_GEO::point_&,_true>
            (&local_6d0,&plane_sur_count,(point *)&seven.char_len);
  pVar2 = std::
          map<int,_GEO::point,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::point>_>_>::
          insert((map<int,_GEO::point,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::point>_>_>
                  *)&lines_map._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_6d0);
  local_6e0 = (_Base_ptr)pVar2.first._M_node;
  local_6d8 = pVar2.second;
  eight.char_len = (double)c->X;
  seven.x = (double)c->Y;
  seven.y = (double)(base_shape.physical_volumes_map._M_t._M_impl.super__Rb_tree_header.
                     _M_node_count._4_4_ +
                    (int)base_shape.physical_volumes_map._M_t._M_impl.super__Rb_tree_header.
                         _M_node_count);
  seven.z = this->model_default_char_length;
  plane_sur_count = plane_sur_count + 1;
  std::pair<const_int,_GEO::point>::pair<int_&,_GEO::point_&,_true>
            (&local_708,&plane_sur_count,(point *)&eight.char_len);
  pVar2 = std::
          map<int,_GEO::point,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::point>_>_>::
          insert((map<int,_GEO::point,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::point>_>_>
                  *)&lines_map._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_708);
  local_718 = (_Base_ptr)pVar2.first._M_node;
  local_710 = pVar2.second;
  _line_count = (double)d->X;
  eight.x = (double)d->Y;
  eight.y = (double)(base_shape.physical_volumes_map._M_t._M_impl.super__Rb_tree_header.
                     _M_node_count._4_4_ +
                    (int)base_shape.physical_volumes_map._M_t._M_impl.super__Rb_tree_header.
                         _M_node_count);
  eight.z = this->model_default_char_length;
  plane_sur_count = plane_sur_count + 1;
  std::pair<const_int,_GEO::point>::pair<int_&,_GEO::point_&,_true>
            (&local_740,&plane_sur_count,(point *)&line_count);
  pVar2 = std::
          map<int,_GEO::point,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::point>_>_>::
          insert((map<int,_GEO::point,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::point>_>_>
                  *)&lines_map._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_740);
  local_750 = (_Base_ptr)pVar2.first._M_node;
  local_748 = pVar2.second;
  local_568.start = plane_sur_count + -3;
  local_568.end = plane_sur_count + -2;
  cur_loop_count = cur_loop_count + 1;
  std::pair<const_int,_GEO::line>::pair<int_&,_GEO::line_&,_true>
            (&local_75c,&cur_loop_count,&local_568);
  pVar3 = std::
          map<int,_GEO::line,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::line>_>_>::
          insert((map<int,_GEO::line,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::line>_>_>
                  *)&curve_loops_map._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_75c);
  local_770 = (_Base_ptr)pVar3.first._M_node;
  local_768 = pVar3.second;
  local_568.start = plane_sur_count + -2;
  local_568.end = plane_sur_count + -1;
  cur_loop_count = cur_loop_count + 1;
  std::pair<const_int,_GEO::line>::pair<int_&,_GEO::line_&,_true>
            (&local_77c,&cur_loop_count,&local_568);
  pVar3 = std::
          map<int,_GEO::line,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::line>_>_>::
          insert((map<int,_GEO::line,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::line>_>_>
                  *)&curve_loops_map._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_77c);
  local_790 = (_Base_ptr)pVar3.first._M_node;
  local_788 = pVar3.second;
  local_568.start = plane_sur_count + -1;
  local_568.end = plane_sur_count;
  cur_loop_count = cur_loop_count + 1;
  std::pair<const_int,_GEO::line>::pair<int_&,_GEO::line_&,_true>
            (&local_79c,&cur_loop_count,&local_568);
  pVar3 = std::
          map<int,_GEO::line,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::line>_>_>::
          insert((map<int,_GEO::line,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::line>_>_>
                  *)&curve_loops_map._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_79c);
  local_7b0 = (_Base_ptr)pVar3.first._M_node;
  local_7a8 = pVar3.second;
  local_568.start = plane_sur_count;
  local_568.end = plane_sur_count + -3;
  cur_loop_count = cur_loop_count + 1;
  std::pair<const_int,_GEO::line>::pair<int_&,_GEO::line_&,_true>
            (&local_7bc,&cur_loop_count,&local_568);
  pVar3 = std::
          map<int,_GEO::line,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::line>_>_>::
          insert((map<int,_GEO::line,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::line>_>_>
                  *)&curve_loops_map._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_7bc);
  local_7d0 = (_Base_ptr)pVar3.first._M_node;
  local_7c8 = pVar3.second;
  vol_count = vol_count + 1;
  local_828 = plane_sur_count + -3;
  local_824 = plane_sur_count + -2;
  local_820 = plane_sur_count + -1;
  local_81c = plane_sur_count;
  local_818 = &local_828;
  local_810 = 4;
  std::allocator<int>::allocator(&local_829);
  __l_04._M_len = local_810;
  __l_04._M_array = local_818;
  std::vector<int,_std::allocator<int>_>::vector(&local_808,__l_04,&local_829);
  std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>::pair<int_&,_true>
            (&local_7f0,&vol_count,&local_808);
  pVar4 = std::
          map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
          ::insert((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                    *)&plane_surfaces_map._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   &local_7f0);
  local_840 = (_Base_ptr)pVar4.first._M_node;
  local_838 = pVar4.second;
  std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>::~pair(&local_7f0);
  std::vector<int,_std::allocator<int>_>::~vector(&local_808);
  std::allocator<int>::~allocator(&local_829);
  sur_loop_count = sur_loop_count + 1;
  std::pair<const_int,_int>::pair<int_&,_int_&,_true>(&local_848,&sur_loop_count,&sur_loop_count);
  pVar5 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::insert
                    ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                     &surface_loops_map._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_848)
  ;
  local_858 = (_Base_ptr)pVar5.first._M_node;
  local_850 = pVar5.second;
  local_568.start = plane_sur_count + -7;
  local_568.end = plane_sur_count + -3;
  cur_loop_count = cur_loop_count + 1;
  std::pair<const_int,_GEO::line>::pair<int_&,_GEO::line_&,_true>
            (&local_864,&cur_loop_count,&local_568);
  pVar3 = std::
          map<int,_GEO::line,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::line>_>_>::
          insert((map<int,_GEO::line,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::line>_>_>
                  *)&curve_loops_map._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_864);
  local_878 = (_Base_ptr)pVar3.first._M_node;
  local_870 = pVar3.second;
  local_568.start = plane_sur_count + -6;
  local_568.end = plane_sur_count + -2;
  cur_loop_count = cur_loop_count + 1;
  std::pair<const_int,_GEO::line>::pair<int_&,_GEO::line_&,_true>
            (&local_884,&cur_loop_count,&local_568);
  pVar3 = std::
          map<int,_GEO::line,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::line>_>_>::
          insert((map<int,_GEO::line,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::line>_>_>
                  *)&curve_loops_map._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_884);
  local_898 = (_Base_ptr)pVar3.first._M_node;
  local_890 = pVar3.second;
  vol_count = vol_count + 1;
  local_8f0 = cur_loop_count + -9;
  local_8ec = cur_loop_count;
  local_8e8 = 5 - cur_loop_count;
  local_8e4 = 1 - cur_loop_count;
  local_8e0 = &local_8f0;
  local_8d8 = 4;
  std::allocator<int>::allocator(&local_8f1);
  __l_03._M_len = local_8d8;
  __l_03._M_array = local_8e0;
  std::vector<int,_std::allocator<int>_>::vector(&local_8d0,__l_03,&local_8f1);
  std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>::pair<int_&,_true>
            (&local_8b8,&vol_count,&local_8d0);
  pVar4 = std::
          map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
          ::insert((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                    *)&plane_surfaces_map._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   &local_8b8);
  local_908 = (_Base_ptr)pVar4.first._M_node;
  local_900 = pVar4.second;
  std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>::~pair(&local_8b8);
  std::vector<int,_std::allocator<int>_>::~vector(&local_8d0);
  std::allocator<int>::~allocator(&local_8f1);
  sur_loop_count = sur_loop_count + 1;
  std::pair<const_int,_int>::pair<int_&,_int_&,_true>(&local_910,&sur_loop_count,&sur_loop_count);
  pVar5 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::insert
                    ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                     &surface_loops_map._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_910)
  ;
  local_920 = (_Base_ptr)pVar5.first._M_node;
  local_918 = pVar5.second;
  local_568.start = plane_sur_count + -5;
  local_568.end = plane_sur_count + -1;
  cur_loop_count = cur_loop_count + 1;
  std::pair<const_int,_GEO::line>::pair<int_&,_GEO::line_&,_true>
            (&local_92c,&cur_loop_count,&local_568);
  pVar3 = std::
          map<int,_GEO::line,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::line>_>_>::
          insert((map<int,_GEO::line,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::line>_>_>
                  *)&curve_loops_map._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_92c);
  local_940 = (_Base_ptr)pVar3.first._M_node;
  local_938 = pVar3.second;
  vol_count = vol_count + 1;
  local_998 = cur_loop_count + -1;
  local_994 = cur_loop_count + -5;
  local_990 = -cur_loop_count;
  local_98c = 9 - cur_loop_count;
  local_988 = &local_998;
  local_980 = 4;
  std::allocator<int>::allocator(&local_999);
  __l_02._M_len = local_980;
  __l_02._M_array = local_988;
  std::vector<int,_std::allocator<int>_>::vector(&local_978,__l_02,&local_999);
  std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>::pair<int_&,_true>
            (&local_960,&vol_count,&local_978);
  pVar4 = std::
          map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
          ::insert((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                    *)&plane_surfaces_map._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   &local_960);
  local_9b0 = (_Base_ptr)pVar4.first._M_node;
  local_9a8 = pVar4.second;
  std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>::~pair(&local_960);
  std::vector<int,_std::allocator<int>_>::~vector(&local_978);
  std::allocator<int>::~allocator(&local_999);
  sur_loop_count = sur_loop_count + 1;
  std::pair<const_int,_int>::pair<int_&,_int_&,_true>(&local_9b8,&sur_loop_count,&sur_loop_count);
  pVar5 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::insert
                    ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                     &surface_loops_map._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_9b8)
  ;
  local_9c8 = (_Base_ptr)pVar5.first._M_node;
  local_9c0 = pVar5.second;
  local_568.start = plane_sur_count + -4;
  local_568.end = plane_sur_count;
  cur_loop_count = cur_loop_count + 1;
  std::pair<const_int,_GEO::line>::pair<int_&,_GEO::line_&,_true>
            (&local_9d4,&cur_loop_count,&local_568);
  pVar3 = std::
          map<int,_GEO::line,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::line>_>_>::
          insert((map<int,_GEO::line,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::line>_>_>
                  *)&curve_loops_map._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_9d4);
  local_9e8 = (_Base_ptr)pVar3.first._M_node;
  local_9e0 = pVar3.second;
  vol_count = vol_count + 1;
  local_a40 = cur_loop_count + -1;
  local_a3c = cur_loop_count + -5;
  local_a38 = -cur_loop_count;
  local_a34 = 9 - cur_loop_count;
  local_a30 = &local_a40;
  local_a28 = 4;
  std::allocator<int>::allocator(&local_a41);
  __l_01._M_len = local_a28;
  __l_01._M_array = local_a30;
  std::vector<int,_std::allocator<int>_>::vector(&local_a20,__l_01,&local_a41);
  std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>::pair<int_&,_true>
            (&local_a08,&vol_count,&local_a20);
  pVar4 = std::
          map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
          ::insert((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                    *)&plane_surfaces_map._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   &local_a08);
  local_a58 = (_Base_ptr)pVar4.first._M_node;
  local_a50 = pVar4.second;
  std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>::~pair(&local_a08);
  std::vector<int,_std::allocator<int>_>::~vector(&local_a20);
  std::allocator<int>::~allocator(&local_a41);
  sur_loop_count = sur_loop_count + 1;
  std::pair<const_int,_int>::pair<int_&,_int_&,_true>(&local_a60,&sur_loop_count,&sur_loop_count);
  pVar5 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::insert
                    ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                     &surface_loops_map._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_a60)
  ;
  local_a70 = (_Base_ptr)pVar5.first._M_node;
  local_a68 = pVar5.second;
  vol_count = vol_count + 1;
  local_ac8 = cur_loop_count + -8;
  local_ac4 = cur_loop_count + -3;
  local_ac0 = 4 - cur_loop_count;
  local_abc = -cur_loop_count;
  local_ab8 = &local_ac8;
  local_ab0 = 4;
  std::allocator<int>::allocator(&local_ac9);
  __l_00._M_len = local_ab0;
  __l_00._M_array = local_ab8;
  std::vector<int,_std::allocator<int>_>::vector(&local_aa8,__l_00,&local_ac9);
  std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>::pair<int_&,_true>
            (&local_a90,&vol_count,&local_aa8);
  pVar4 = std::
          map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
          ::insert((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                    *)&plane_surfaces_map._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   &local_a90);
  local_ae0 = (_Base_ptr)pVar4.first._M_node;
  local_ad8 = pVar4.second;
  std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>::~pair(&local_a90);
  std::vector<int,_std::allocator<int>_>::~vector(&local_aa8);
  std::allocator<int>::~allocator(&local_ac9);
  sur_loop_count = sur_loop_count + 1;
  std::pair<const_int,_int>::pair<int_&,_int_&,_true>(&local_ae8,&sur_loop_count,&sur_loop_count);
  pVar5 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::insert
                    ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                     &surface_loops_map._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_ae8)
  ;
  local_af8 = (_Base_ptr)pVar5.first._M_node;
  local_af0 = pVar5.second;
  local_47c = local_47c + 1;
  local_b58 = sur_loop_count + -5;
  local_b54 = sur_loop_count + -4;
  local_b50 = sur_loop_count + -3;
  local_b4c = sur_loop_count + -2;
  local_b48 = sur_loop_count + -1;
  local_b44 = sur_loop_count;
  local_b40 = &local_b58;
  local_b38 = 6;
  std::allocator<int>::allocator(&local_b59);
  __l._M_len = local_b38;
  __l._M_array = local_b40;
  std::vector<int,_std::allocator<int>_>::vector(&local_b30,__l,&local_b59);
  std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>::pair<int_&,_true>
            (&local_b18,&local_47c,&local_b30);
  pVar4 = std::
          map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
          ::insert((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                    *)&volumes_map._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_b18);
  local_b70 = (_Base_ptr)pVar4.first._M_node;
  local_b68 = pVar4.second;
  std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>::~pair(&local_b18);
  std::vector<int,_std::allocator<int>_>::~vector(&local_b30);
  std::allocator<int>::~allocator(&local_b59);
  local_480 = local_480 + 1;
  std::pair<const_int,_int>::pair<int_&,_int_&,_true>(&local_b78,&local_480,&local_47c);
  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::insert
            ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
             &one.char_len,&local_b78);
  GEO::geofile::insert_points_map
            ((geofile *)local_238,
             (map<int,_GEO::point,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::point>_>_>
              *)&lines_map._M_t._M_impl.super__Rb_tree_header._M_node_count);
  GEO::geofile::insert_lines_map
            ((geofile *)local_238,
             (map<int,_GEO::line,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::line>_>_>
              *)&curve_loops_map._M_t._M_impl.super__Rb_tree_header._M_node_count);
  GEO::geofile::insert_curve_loops_map
            ((geofile *)local_238,
             (map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
              *)&plane_surfaces_map._M_t._M_impl.super__Rb_tree_header._M_node_count);
  GEO::geofile::insert_plane_surfaces_map
            ((geofile *)local_238,
             (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
             &surface_loops_map._M_t._M_impl.super__Rb_tree_header._M_node_count);
  GEO::geofile::insert_surface_loops_map
            ((geofile *)local_238,
             (map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
              *)&volumes_map._M_t._M_impl.super__Rb_tree_header._M_node_count);
  GEO::geofile::insert_volumes_map
            ((geofile *)local_238,
             (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
             &one.char_len);
  GEO::geofile::disable_char_len((geofile *)local_238);
  GEO::geofile::operator=(generated_geofile,(geofile *)local_238);
  this->pnt_cnt = plane_sur_count;
  this->ln_cnt = cur_loop_count;
  this->cl_cnt = vol_count;
  this->ps_cnt = sur_loop_count;
  this->sl_cnt = local_47c;
  this->vol_cnt = local_480;
  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::~map
            ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
             &one.char_len);
  std::
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::~map((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
          *)&volumes_map._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::~map
            ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
             &surface_loops_map._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::~map((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
          *)&plane_surfaces_map._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::map<int,_GEO::line,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::line>_>_>::~map
            ((map<int,_GEO::line,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::line>_>_>
              *)&curve_loops_map._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::map<int,_GEO::point,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::point>_>_>::
  ~map((map<int,_GEO::point,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::point>_>_> *)
       &lines_map._M_t._M_impl.super__Rb_tree_header._M_node_count);
  GEO::geofile::~geofile((geofile *)local_238);
  return;
}

Assistant:

void MODEL3D::three_dim_model::build_layer_box(
 const int &layer_number,
const ClipperLib::IntPoint &a,
const ClipperLib::IntPoint &b,
const ClipperLib::IntPoint &c,
const ClipperLib::IntPoint &d,
GEO::geofile &generated_geofile )
{
    int base_height = proc_info_map[layer_number].z_start;
    int thickness = proc_info_map[layer_number].thickness;
    GEO::geofile base_shape;
    base_shape.switch_to_OpenCASCADE();
    std::map<int, GEO::point> points_map;
    std::map<int, GEO::line> lines_map;
    std::map<int, std::vector<int>> curve_loops_map;
    std::map<int, int> plane_surfaces_map;
    std::map<int, std::vector<int>> surface_loops_map;
    std::map<int, int> volumes_map;
    GEO::point one, two, three, four, five, six, seven, eight;
    int point_count = pnt_cnt;
    int line_count = ln_cnt;
    int plane_sur_count = ps_cnt;
    int cur_loop_count = cl_cnt;
    int sur_loop_count = sl_cnt;
    int vol_count = vol_cnt;
    //------- bottom --------
    one.x   = a.X;
    one.y   = a.Y;
    one.z   = base_height;
    one.char_len = model_default_char_length;
    points_map.insert({++point_count, one});
    two.x   = b.X;
    two.y   = b.Y;
    two.z   = base_height;
    two.char_len = model_default_char_length;
    points_map.insert({++point_count, two});
    three.x = c.X;
    three.y = c.Y;
    three.z = base_height;
    three.char_len = model_default_char_length;
    points_map.insert({++point_count, three});
    four.x  = d.X;
    four.y  = d.Y;
    four.z  = base_height;
    four.char_len = model_default_char_length;
    points_map.insert({++point_count, four});
    GEO::line in_line;
    in_line.start = point_count-3;
    in_line.end = point_count-2;
    lines_map.insert({++line_count, in_line});
    in_line.start = point_count-2;
    in_line.end = point_count-1;
    lines_map.insert({++line_count, in_line});
    in_line.start = point_count-1;
    in_line.end = point_count;
    lines_map.insert({++line_count, in_line});
    in_line.start = point_count;
    in_line.end = point_count-3;
    lines_map.insert({++line_count, in_line});
    curve_loops_map.insert({++cur_loop_count, {(point_count-3), (point_count-2), (point_count-1), point_count}});
    plane_surfaces_map.insert({++plane_sur_count, plane_sur_count});
    //-------- top ---------
    five.x   = a.X;
    five.y   = a.Y;
    five.z   = base_height + thickness;
    five.char_len = model_default_char_length;
    points_map.insert({++point_count, five});
    six.x    = b.X;
    six.y    = b.Y;
    six.z    = base_height + thickness;
    six.char_len = model_default_char_length;
    points_map.insert({++point_count, six});
    seven.x  = c.X;
    seven.y  = c.Y;
    seven.z  = base_height + thickness;
    seven.char_len = model_default_char_length;
    points_map.insert({++point_count, seven});
    eight.x  = d.X;
    eight.y  = d.Y;
    eight.z  = base_height + thickness;
    eight.char_len = model_default_char_length;
    points_map.insert({++point_count, eight});
    in_line.start = point_count-3;
    in_line.end = point_count-2;
    lines_map.insert({++line_count, in_line});
    in_line.start = point_count-2;
    in_line.end = point_count-1;
    lines_map.insert({++line_count, in_line});
    in_line.start = point_count-1;
    in_line.end = point_count;
    lines_map.insert({++line_count, in_line});
    in_line.start = point_count;
    in_line.end = point_count-3;
    lines_map.insert({++line_count, in_line});
    curve_loops_map.insert({++cur_loop_count, {point_count-3,point_count-2,point_count-1,point_count}});
    plane_surfaces_map.insert({++plane_sur_count, plane_sur_count});
    // side 1;
    in_line.start = point_count-7;
    in_line.end = point_count-3;
    lines_map.insert({++line_count, in_line});
    in_line.start = point_count-6;
    in_line.end = point_count-2;
    lines_map.insert({++line_count, in_line});
    curve_loops_map.insert({++cur_loop_count, {line_count-9,line_count,-(line_count-5),-(line_count-1)}});
    plane_surfaces_map.insert({++plane_sur_count, plane_sur_count});
    // side 2;
    in_line.start = point_count-5;
    in_line.end = point_count-1;
    lines_map.insert({++line_count, in_line});
    curve_loops_map.insert({++cur_loop_count, {line_count-1,line_count-5,-line_count,-(line_count-9)}});
    plane_surfaces_map.insert({++plane_sur_count, plane_sur_count});
    // side 3;
    in_line.start = point_count-4;
    in_line.end = point_count;
    lines_map.insert({++line_count, in_line});
    curve_loops_map.insert({++cur_loop_count, {line_count-1,line_count-5,-line_count,-(line_count-9)}});
    plane_surfaces_map.insert({++plane_sur_count, plane_sur_count});
    // side 4;
    curve_loops_map.insert({++cur_loop_count, {line_count-8,line_count-3,-(line_count-4),-line_count}});
    plane_surfaces_map.insert({++plane_sur_count, plane_sur_count});
    // enclose
    surface_loops_map.insert({++sur_loop_count, {plane_sur_count-5,plane_sur_count-4,
                                                 plane_sur_count-3,plane_sur_count-2,
                                                 plane_sur_count-1, plane_sur_count}});
    volumes_map.insert({++vol_count, sur_loop_count});
    base_shape.insert_points_map(points_map);
    base_shape.insert_lines_map(lines_map);
    base_shape.insert_curve_loops_map(curve_loops_map);
    base_shape.insert_plane_surfaces_map(plane_surfaces_map);
    base_shape.insert_surface_loops_map(surface_loops_map);
    base_shape.insert_volumes_map(volumes_map);
    base_shape.disable_char_len();
    generated_geofile = base_shape;
    pnt_cnt = point_count;
    ln_cnt = line_count;
    cl_cnt = cur_loop_count;
    ps_cnt = plane_sur_count;
    sl_cnt = sur_loop_count;
    vol_cnt = vol_count;
    // std::string output_path = "data/3DGen/" +
    // std::to_string(layer_number) + "_P_0.geo";
    // base_shape.export_geofile(output_path); //For debugging
    // __asm("nop");
}